

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode
JsGetPropertyCommon(ScriptContext *scriptContext,RecyclableObject *object,
                   PropertyRecord *propertyRecord,JsValueRef *value)

{
  code *pcVar1;
  bool bVar2;
  PropertyId propertyId;
  BOOL BVar3;
  ThreadContext *this;
  undefined4 *puVar4;
  Var pvVar5;
  JsValueRef *value_local;
  PropertyRecord *propertyRecord_local;
  RecyclableObject *object_local;
  ScriptContext *scriptContext_local;
  
  this = Js::ScriptContext::GetThreadContext(scriptContext);
  bVar2 = ThreadContext::IsScriptActive(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Jsrt.cpp"
                       ,0x604,"(scriptContext->GetThreadContext()->IsScriptActive())",
                       "Caller is expected to be under ContextAPIWrapper!");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  propertyId = Js::PropertyRecord::GetPropertyId(propertyRecord);
  pvVar5 = Js::JavascriptOperators::GetPropertyNoCache(object,propertyId,scriptContext);
  *value = pvVar5;
  if (*value != (JsValueRef)0x0) {
    BVar3 = Js::CrossSite::NeedMarshalVar(*value,scriptContext);
    if (BVar3 != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Jsrt.cpp"
                         ,0x607,
                         "(*value == nullptr || !Js::CrossSite::NeedMarshalVar(*value, scriptContext))"
                         ,
                         "*value == nullptr || !Js::CrossSite::NeedMarshalVar(*value, scriptContext)"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
  }
  return JsNoError;
}

Assistant:

static JsErrorCode JsGetPropertyCommon(Js::ScriptContext * scriptContext,
    _In_ Js::RecyclableObject * object,
    _In_ const Js::PropertyRecord * propertyRecord, _Out_ JsValueRef *value)
{
    AssertMsg(scriptContext->GetThreadContext()->IsScriptActive(), "Caller is expected to be under ContextAPIWrapper!");

    *value = Js::JavascriptOperators::GetPropertyNoCache(object, propertyRecord->GetPropertyId(), scriptContext);
    Assert(*value == nullptr || !Js::CrossSite::NeedMarshalVar(*value, scriptContext));

    return JsNoError;
}